

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O0

void testimages(wins *wins_ar,int ar_len)

{
  byte bVar1;
  char *pcVar2;
  ostream *this;
  Am_Image_Array local_58 [8];
  Am_Image_Array amulet;
  Am_Image_Array bogus;
  Am_Image_Array kling;
  Am_Image_Array entd;
  undefined8 local_30;
  Am_Image_Array local_28 [8];
  Am_Image_Array ent;
  Am_Drawonable *d;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  d._0_4_ = 0;
  while( true ) {
    if (ar_len <= (int)d) {
      return;
    }
    _ent = wins_ar[(int)d].d4;
    pcVar2 = (char *)Am_Merge_Pathname("images/ent.xbm");
    Am_Image_Array::Am_Image_Array(local_28,pcVar2);
    bVar1 = Am_Image_Array::Valid();
    if ((bVar1 & 1) == 0) {
      local_30 = Am_Error("ent bitmap not found");
      goto LAB_001063a3;
    }
    (**(code **)(*(long *)_ent + 0x138))
              (_ent,0xa0,0xf,0xffffffff,0xffffffff,local_28,0,0,&Am_Purple,&Am_White,0,0);
    (**(code **)(*(long *)_ent + 0xa0))();
    pcVar2 = (char *)Am_Merge_Pathname("images/ent_d.xbm");
    Am_Image_Array::Am_Image_Array(&kling,pcVar2);
    bVar1 = Am_Image_Array::Valid();
    if ((bVar1 & 1) == 0) break;
    (**(code **)(*(long *)_ent + 0x138))
              (_ent,0xa0,0x37,0xffffffff,0xffffffff,&kling,0,0,&Am_Black,&Am_No_Style,0,0);
    pcVar2 = (char *)Am_Merge_Pathname("images/kling.xbm");
    Am_Image_Array::Am_Image_Array(&bogus,pcVar2);
    bVar1 = Am_Image_Array::Valid();
    if ((bVar1 & 1) == 0) {
      local_30 = Am_Error("kling bitmap not found");
LAB_00106391:
      Am_Image_Array::~Am_Image_Array(&bogus);
      goto LAB_0010639a;
    }
    (**(code **)(*(long *)_ent + 0x138))
              (_ent,0xa0,0x5f,0xffffffff,0xffffffff,&bogus,0,0,&Am_Red,&Am_White,0,0);
    this = std::operator<<((ostream *)&std::cerr,"testbits: Testing bogus GIF file name.");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    Am_Image_Array::Am_Image_Array(&amulet,"bogus_file.gif");
    pcVar2 = (char *)Am_Merge_Pathname("images/Am_med.gif");
    Am_Image_Array::Am_Image_Array(local_58,pcVar2);
    bVar1 = Am_Image_Array::Valid();
    if ((bVar1 & 1) == 0) {
      local_30 = Am_Error("Amulet gif file not found");
      Am_Image_Array::~Am_Image_Array(&amulet);
      goto LAB_00106391;
    }
    (**(code **)(*(long *)_ent + 0x138))
              (_ent,0xf,0xf,0xffffffff,0xffffffff,local_58,0,0,&Am_Black,&Am_White,0,0);
    Am_Image_Array::~Am_Image_Array(local_58);
    Am_Image_Array::~Am_Image_Array(&amulet);
    Am_Image_Array::~Am_Image_Array(&bogus);
    Am_Image_Array::~Am_Image_Array(&kling);
    Am_Image_Array::~Am_Image_Array(local_28);
    d._0_4_ = (int)d + 1;
  }
  local_30 = Am_Error("entd bitmap not found");
LAB_0010639a:
  Am_Image_Array::~Am_Image_Array(&kling);
LAB_001063a3:
  Am_Image_Array::~Am_Image_Array(local_28);
  _Unwind_Resume(local_30);
}

Assistant:

void
testimages(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d4;

    Am_Image_Array ent(Am_Merge_Pathname(IMFN_ENT));

    if (!ent.Valid())
      Am_Error("ent bitmap not found");
    d->Draw_Image(160, 15, -1, -1, ent, 0, 0, Am_Purple, Am_White);
    d->Flush_Output();

    Am_Image_Array entd(Am_Merge_Pathname(IMFN_ENT_D));
    if (!entd.Valid())
      Am_Error("entd bitmap not found");
    d->Draw_Image(160, 55, -1, -1, entd, 0, 0, Am_Black, Am_No_Style);

    Am_Image_Array kling(Am_Merge_Pathname(IMFN_KLING));
    if (!kling.Valid())
      Am_Error("kling bitmap not found");
    d->Draw_Image(160, 95, -1, -1, kling, 0, 0, Am_Red, Am_White);

    std::cerr << "testbits: Testing bogus GIF file name." << std::endl;
    Am_Image_Array bogus("bogus_file.gif");

    Am_Image_Array amulet(Am_Merge_Pathname(AMULET_GIF));
    if (!amulet.Valid())
      Am_Error("Amulet gif file not found");
    d->Draw_Image(15, 15, -1, -1, amulet, 0, 0, Am_Black, Am_White);
    // the bg/fg styles shouldn't matter
  }
}